

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  Layer *pLVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Mat *pMVar26;
  int u;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  undefined8 *puVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  void *pvVar44;
  void *pvVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  int i;
  uint uVar49;
  int iVar50;
  uint uVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  byte bVar58;
  int y_2;
  float *pfVar59;
  long lVar60;
  int iVar61;
  undefined8 *puVar62;
  void *pvVar63;
  float *pfVar64;
  int i_2;
  int iVar65;
  uint uVar66;
  int x;
  ulong uVar67;
  ulong uVar68;
  void *pvVar69;
  bool bVar70;
  undefined4 uVar71;
  undefined1 auVar72 [16];
  undefined1 extraout_var [12];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  v4sf one;
  float fVar91;
  float fVar92;
  float fVar104;
  float fVar105;
  __m128 pos;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar106;
  undefined1 auVar96 [16];
  float fVar93;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 (*local_240) [16];
  void *local_228;
  Mat local_1c8;
  undefined1 local_178 [16];
  long local_160;
  undefined1 local_158 [16];
  Option *local_148;
  int local_13c;
  ulong local_138;
  Mat *local_130;
  void *local_128;
  void *local_120;
  ulong local_118;
  void *local_110;
  int *local_108;
  size_t local_100;
  int local_f8;
  Allocator *local_f0;
  undefined4 local_e8;
  int iStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  size_t local_d0;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  long *local_a8;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  undefined8 local_88;
  Option opt_b;
  int iVar28;
  
  local_178._8_8_ = local_178._0_8_;
  uVar66 = bottom_blob->w;
  uVar51 = bottom_blob->h;
  uVar55 = bottom_blob->elemsize;
  local_138 = (ulong)bottom_blob->elempack;
  iVar29 = (this->super_Deconvolution).dilation_w;
  uVar49 = (this->super_Deconvolution).num_output;
  iVar30 = (this->super_Deconvolution).kernel_w;
  iVar42 = (this->super_Deconvolution).stride_w;
  local_13c = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar65 = (this->super_Deconvolution).stride_h;
  bVar58 = (uVar49 & 3) == 0 & opt->use_packing_layout;
  iVar50 = (this->super_Deconvolution).output_pad_right;
  iVar5 = (this->super_Deconvolution).output_pad_bottom;
  iVar61 = (uint)bVar58 + (uint)bVar58 * 2 + 1;
  local_178._1_7_ = 0;
  local_178[0] = bVar58 * '\x02';
  uVar57 = (long)(int)uVar49 / (long)iVar61;
  uVar43 = uVar57 & 0xffffffff;
  local_1c8.cstep = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  auVar74._0_4_ = -(uint)(0 < (this->super_Deconvolution).pad_left);
  auVar74._4_4_ = -(uint)(0 < (this->super_Deconvolution).pad_right);
  auVar74._8_4_ = -(uint)(0 < (this->super_Deconvolution).pad_top);
  auVar74._12_4_ = -(uint)(0 < (this->super_Deconvolution).pad_bottom);
  iVar28 = (int)uVar57;
  iVar27 = movmskps(iVar28,auVar74);
  lVar41 = 0x10;
  if ((iVar27 == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar41 = 8, &local_1c8 != top_blob)))) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_1c8.data = top_blob->data;
    local_1c8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1c8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1c8.elemsize = top_blob->elemsize;
    local_1c8.elempack = top_blob->elempack;
    local_1c8.allocator = top_blob->allocator;
    uVar20 = top_blob->dims;
    uVar21 = top_blob->w;
    uVar22 = top_blob->h;
    uVar23 = top_blob->d;
    local_1c8.c = top_blob->c;
    local_1c8.cstep = top_blob->cstep;
    local_1c8.dims = uVar20;
    local_1c8.w = uVar21;
    local_1c8.h = uVar22;
    local_1c8.d = uVar23;
  }
  iVar29 = (iVar30 + -1) * iVar29;
  iVar42 = iVar50 + (uVar66 - 1) * iVar42 + iVar29 + 1;
  local_148 = opt;
  local_130 = top_blob;
  Mat::create(&local_1c8,iVar42,iVar5 + 1 + (uVar51 - 1) * iVar65 + local_13c,iVar28,
              uVar55 / local_138 << bVar58 * '\x02',iVar61,*(Allocator **)(&opt->lightmode + lVar41)
             );
  auVar79 = _DAT_005386b0;
  auVar74 = _DAT_00538670;
  iVar30 = -100;
  if ((local_1c8.data != (void *)0x0) && (local_1c8.cstep * (long)local_1c8.c != 0)) {
    uVar49 = (this->super_Deconvolution).kernel_w;
    uVar54 = (this->super_Deconvolution).kernel_h;
    local_160 = (long)(int)(uVar54 * uVar49);
    if (local_148->use_sgemm_convolution == true) {
      local_110 = bottom_blob->data;
      local_108 = bottom_blob->refcount;
      local_100 = bottom_blob->elemsize;
      local_f8 = bottom_blob->elempack;
      local_f0 = bottom_blob->allocator;
      uVar24 = bottom_blob->dims;
      uVar25 = bottom_blob->d;
      iVar29 = bottom_blob->w;
      iVar30 = bottom_blob->h;
      local_d8 = bottom_blob->c;
      local_d0 = bottom_blob->cstep;
      if (local_108 != (int *)0x0) {
        LOCK();
        *local_108 = *local_108 + 1;
        UNLOCK();
        iVar29 = bottom_blob->w;
        iVar30 = bottom_blob->h;
      }
      local_88 = 0;
      _local_e8 = CONCAT44(iVar30 * iVar29,uVar24);
      _uStack_e0 = CONCAT44(uVar25,1);
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bc = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      local_a8 = (long *)0x0;
      uStack_a0 = 0;
      iStack_9c = 0;
      uStack_98 = 0;
      uStack_94 = 0;
      opt_b.lightmode = local_148->lightmode;
      opt_b.use_shader_pack8 = local_148->use_shader_pack8;
      opt_b.use_subgroup_ops = local_148->use_subgroup_ops;
      opt_b.use_reserved_0 = local_148->use_reserved_0;
      opt_b.num_threads = local_148->num_threads;
      opt_b.workspace_allocator._0_4_ = *(undefined4 *)&local_148->workspace_allocator;
      opt_b.workspace_allocator._4_4_ = *(undefined4 *)((long)&local_148->workspace_allocator + 4);
      opt_b.openmp_blocktime = local_148->openmp_blocktime;
      opt_b.use_winograd_convolution = local_148->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_148->use_sgemm_convolution;
      opt_b.use_int8_inference = local_148->use_int8_inference;
      opt_b.use_vulkan_compute = local_148->use_vulkan_compute;
      opt_b.use_bf16_storage = local_148->use_bf16_storage;
      opt_b.use_fp16_packed = local_148->use_fp16_packed;
      opt_b.use_fp16_storage = local_148->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_148->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_148->use_int8_packed;
      opt_b.use_int8_storage = local_148->use_int8_storage;
      opt_b.use_int8_arithmetic = local_148->use_int8_arithmetic;
      opt_b.use_packing_layout = local_148->use_packing_layout;
      opt_b.vulkan_device_index = local_148->vulkan_device_index;
      opt_b.use_reserved_1 = local_148->use_reserved_1;
      opt_b.use_image_storage = local_148->use_image_storage;
      opt_b.use_tensor_storage = local_148->use_tensor_storage;
      opt_b.use_reserved_2 = local_148->use_reserved_2;
      opt_b.flush_denormals = local_148->flush_denormals;
      opt_b.use_local_pool_allocator = local_148->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_148->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_148->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_148->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_148->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_148->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_148->use_a53_a55_optimized_kernel;
      opt_b.use_fp16_uniform = local_148->use_fp16_uniform;
      opt_b.use_int8_uniform = local_148->use_int8_uniform;
      opt_b.use_reserved_9 = local_148->use_reserved_9;
      opt_b.use_reserved_10 = local_148->use_reserved_10;
      opt_b.use_reserved_11 = local_148->use_reserved_11;
      opt_b.blob_allocator = local_1c8.allocator;
      iVar30 = (*this->gemm->_vptr_Layer[7])();
      if (iVar30 != 0) {
        piVar6 = (int *)CONCAT44(uStack_bc,uStack_c0);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_a8 == (long *)0x0) {
              free(local_c8);
            }
            else {
              (**(code **)(*local_a8 + 0x18))();
            }
          }
        }
        if (local_108 != (int *)0x0) {
          LOCK();
          *local_108 = *local_108 + -1;
          UNLOCK();
          if (*local_108 == 0) {
            if (local_f0 == (Allocator *)0x0) {
              free(local_110);
            }
            else {
              (*local_f0->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_00265995;
      }
      iVar29 = iVar42 * (this->super_Deconvolution).stride_h -
               (this->super_Deconvolution).stride_w * uVar66 << (local_178[0] & 0x1f);
      if (bVar58 == 0) {
        uVar55 = (ulong)uVar66;
        if ((int)uVar66 < 1) {
          uVar55 = 0;
        }
        if ((int)uVar51 < 1) {
          uVar51 = 0;
        }
        if (iVar28 < 1) {
          uVar43 = 0;
        }
        local_158._0_8_ = local_c8;
        lVar41 = (long)local_1c8.h * (long)local_1c8.w;
        pvVar9 = (this->super_Deconvolution).bias_data.data;
        bVar70 = (long)(this->super_Deconvolution).bias_data.c *
                 (this->super_Deconvolution).bias_data.cstep == 0;
        uVar66 = (this->super_Deconvolution).kernel_h;
        lVar60 = (long)local_1c8.w * local_1c8.elemsize;
        local_178._0_8_ = lVar60;
        if ((int)uVar66 < 1) {
          uVar66 = 0;
        }
        lVar56 = (long)iStack_9c * CONCAT44(uStack_b4,local_b8) * local_160;
        local_160 = CONCAT71(local_160._1_7_,bVar70 || pvVar9 == (void *)0x0);
        pvVar69 = local_1c8.data;
        for (uVar57 = 0; uVar57 != uVar43; uVar57 = uVar57 + 1) {
          iVar30 = (int)((local_1c8.elemsize * lVar41 + 0xf & 0xfffffffffffffff0) /
                        local_1c8.elemsize);
          if (local_1c8.dims == 4) {
            iVar30 = (int)lVar41;
          }
          uVar71 = 0;
          if (!bVar70 && pvVar9 != (void *)0x0) {
            uVar71 = *(undefined4 *)((long)pvVar9 + uVar57 * 4);
          }
          pfVar59 = (float *)(uVar57 * lVar56 + (long)local_c8);
          iVar30 = iVar30 * local_1c8.d;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          for (lVar46 = 0; iVar30 != (int)lVar46; lVar46 = lVar46 + 1) {
            *(undefined4 *)((long)pvVar69 + lVar46 * 4) = uVar71;
          }
          uVar49 = (this->super_Deconvolution).kernel_w;
          uVar47 = 0;
          uVar68 = (ulong)uVar49;
          if ((int)uVar49 < 1) {
            uVar68 = uVar47;
          }
          while (uVar49 = (uint)uVar47, uVar49 != uVar66) {
            iVar30 = (this->super_Deconvolution).dilation_h;
            iVar42 = (this->super_Deconvolution).dilation_w;
            for (uVar47 = 0; uVar47 != uVar68; uVar47 = uVar47 + 1) {
              pfVar64 = (float *)((long)local_1c8.data +
                                 uVar47 * (long)iVar42 * 4 +
                                 (long)(int)uVar49 * (long)iVar30 * lVar60 +
                                 local_1c8.cstep * local_1c8.elemsize * uVar57);
              for (uVar54 = 0; uVar54 != uVar51; uVar54 = uVar54 + 1) {
                iVar65 = (this->super_Deconvolution).stride_w;
                uVar52 = uVar55;
                while (iVar50 = (int)uVar52, uVar52 = (ulong)(iVar50 - 1), iVar50 != 0) {
                  *pfVar64 = *pfVar64 + *pfVar59;
                  pfVar59 = pfVar59 + 1;
                  pfVar64 = pfVar64 + iVar65;
                }
                pfVar64 = pfVar64 + iVar29;
              }
            }
            uVar47 = (ulong)(uVar49 + 1);
          }
          pvVar69 = (void *)((long)pvVar69 + local_1c8.cstep * local_1c8.elemsize);
        }
      }
      else {
        if ((int)uVar66 < 1) {
          uVar66 = 0;
        }
        if ((int)uVar51 < 1) {
          uVar51 = 0;
        }
        if (iVar28 < 1) {
          uVar43 = 0;
        }
        for (uVar55 = 0; uVar55 != uVar43; uVar55 = uVar55 + 1) {
          pfVar59 = (float *)((long)iStack_9c * uVar55 * local_160 * CONCAT44(uStack_b4,local_b8) +
                             (long)local_c8);
          puVar62 = (undefined8 *)
                    (local_1c8.cstep * uVar55 * local_1c8.elemsize + (long)local_1c8.data);
          uVar68 = (long)local_1c8.h * (long)local_1c8.w;
          uVar57 = (local_1c8.elemsize * uVar68 + 0xf & 0xfffffffffffffff0) / local_1c8.elemsize;
          if (local_1c8.dims == 4) {
            uVar57 = uVar68;
          }
          pvVar9 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar9 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar30 = local_1c8.d * (int)uVar57;
            puVar40 = puVar62;
            if (iVar30 < 1) {
              iVar30 = 0;
            }
            while (iVar30 != 0) {
              *puVar40 = 0;
              puVar40[1] = 0;
              puVar40 = puVar40 + 2;
              iVar30 = iVar30 + -1;
            }
          }
          else {
            puVar1 = (undefined4 *)((long)pvVar9 + uVar55 * 0x10);
            uVar71 = *puVar1;
            uVar4 = puVar1[1];
            uVar18 = puVar1[2];
            uVar19 = puVar1[3];
            iVar30 = local_1c8.d * (int)uVar57;
            puVar40 = puVar62;
            if (iVar30 < 1) {
              iVar30 = 0;
            }
            while (iVar30 != 0) {
              *(undefined4 *)puVar40 = uVar71;
              *(undefined4 *)((long)puVar40 + 4) = uVar4;
              *(undefined4 *)(puVar40 + 1) = uVar18;
              *(undefined4 *)((long)puVar40 + 0xc) = uVar19;
              puVar40 = puVar40 + 2;
              iVar30 = iVar30 + -1;
            }
          }
          for (iVar30 = 0; iVar30 < (this->super_Deconvolution).kernel_h; iVar30 = iVar30 + 1) {
            for (iVar42 = 0; iVar42 < (this->super_Deconvolution).kernel_w; iVar42 = iVar42 + 1) {
              pfVar64 = (float *)((long)puVar62 +
                                 (long)((this->super_Deconvolution).dilation_w * iVar42 * 4) * 4 +
                                 (long)iVar30 * (long)(this->super_Deconvolution).dilation_h *
                                 local_1c8.elemsize * (long)local_1c8.w);
              for (uVar49 = 0; uVar54 = uVar66, uVar49 != uVar51; uVar49 = uVar49 + 1) {
                while (uVar54 != 0) {
                  fVar89 = pfVar59[1];
                  auVar87._0_4_ = pfVar59[2];
                  fVar90 = pfVar59[3];
                  *pfVar64 = *pfVar59 + *pfVar64;
                  pfVar64[1] = fVar89 + pfVar64[1];
                  pfVar64[2] = auVar87._0_4_ + pfVar64[2];
                  pfVar64[3] = fVar90 + pfVar64[3];
                  pfVar64 = pfVar64 + (long)(this->super_Deconvolution).stride_w * 4;
                  pfVar59 = pfVar59 + 4;
                  uVar54 = uVar54 - 1;
                }
                pfVar64 = pfVar64 + iVar29;
              }
            }
          }
        }
      }
      pLVar10 = this->activation;
      if (pLVar10 != (Layer *)0x0) {
        (*pLVar10->_vptr_Layer[9])(pLVar10,&local_1c8,local_148);
      }
      piVar6 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_a8 == (long *)0x0) {
            free(local_c8);
          }
          else {
            (**(code **)(*local_a8 + 0x18))();
          }
        }
      }
      if (local_108 != (int *)0x0) {
        LOCK();
        *local_108 = *local_108 + -1;
        UNLOCK();
        if (*local_108 == 0) {
          if (local_f0 == (Allocator *)0x0) {
            free(local_110);
          }
          else {
            (*local_f0->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      bVar58 = bVar58 ^ 1;
      if ((int)local_138 == 4 && bVar58 == 0) {
        iVar30 = (this->super_Deconvolution).dilation_w;
        iVar42 = (this->super_Deconvolution).dilation_h;
        iVar65 = (this->super_Deconvolution).stride_w;
        iVar50 = (this->super_Deconvolution).stride_h;
        iVar5 = (this->super_Deconvolution).activation_type;
        pvVar9 = (this->super_Deconvolution).bias_data.data;
        uVar55 = 0;
        if (0 < (int)uVar49) {
          uVar55 = (ulong)uVar49;
        }
        uVar57 = 0;
        if (0 < (int)uVar54) {
          uVar57 = (ulong)uVar54;
        }
        uVar66 = local_1c8.c;
        if (local_1c8.c < 1) {
          uVar66 = 0;
        }
        auVar72 = (undefined1  [16])0x0;
        fVar89 = (float)DAT_005386b0;
        auVar87._0_4_ = DAT_005386b0._4_4_;
        fVar90 = DAT_005386b0._8_4_;
        fVar91 = DAT_005386b0._12_4_;
        auVar81 = _DAT_00538680;
        for (uVar43 = 0; uVar43 != uVar66; uVar43 = uVar43 + 1) {
          local_240 = (undefined1 (*) [16])
                      (local_1c8.cstep * uVar43 * local_1c8.elemsize + (long)local_1c8.data);
          iVar28 = bottom_blob->w;
          iVar27 = bottom_blob->h;
          uVar48 = 0;
          uVar51 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar51 = uVar48;
          }
          uVar36 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar36 = uVar48;
          }
          uVar35 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar35 = uVar48;
          }
          for (; uVar48 != uVar35; uVar48 = uVar48 + 1) {
            iVar61 = (1 - uVar49) * iVar30;
            for (uVar33 = 0; uVar33 != uVar36; uVar33 = uVar33 + 1) {
              if (pvVar9 == (void *)0x0) {
                auVar76 = ZEXT816(0);
              }
              else {
                auVar76 = *(undefined1 (*) [16])((long)pvVar9 + uVar43 * 0x10);
              }
              lVar41 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar43 * (this->weight_data_tm).elemsize +
                       0x30;
              for (uVar68 = 0; uVar68 != uVar51; uVar68 = uVar68 + 1) {
                pvVar69 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar68 +
                                  (long)bottom_blob->data);
                local_178._0_8_ = pvVar69;
                local_158._0_8_ = lVar41;
                lVar60 = lVar41;
                for (uVar47 = 0; uVar47 != uVar57; uVar47 = uVar47 + 1) {
                  iVar31 = (((int)uVar47 - uVar54) + 1) * iVar42 + uVar48;
                  if (((-1 < iVar31) && (iVar32 = iVar31 / iVar50, iVar31 % iVar50 == 0)) &&
                     (iVar32 < iVar27)) {
                    lVar56 = (long)iVar32 * (long)bottom_blob->w * bottom_blob->elemsize;
                    iVar31 = iVar61;
                    for (lVar46 = 0; uVar55 * 0x40 != lVar46; lVar46 = lVar46 + 0x40) {
                      if (((-1 < iVar31) && (iVar32 = iVar31 / iVar65, iVar31 % iVar65 == 0)) &&
                         (iVar32 < iVar28)) {
                        lVar38 = (long)(iVar32 << 2);
                        fVar80 = *(float *)((long)pvVar69 + lVar38 * 4 + lVar56);
                        fVar93 = *(float *)((long)pvVar69 + lVar38 * 4 + lVar56 + 4);
                        pfVar59 = (float *)(lVar60 + -0x30 + lVar46);
                        fVar107 = *(float *)((long)pvVar69 + lVar38 * 4 + lVar56 + 8);
                        fVar109 = auVar76._4_4_;
                        fVar110 = auVar76._8_4_;
                        fVar92 = auVar76._12_4_;
                        fVar108 = *(float *)((long)pvVar69 + lVar38 * 4 + lVar56 + 0xc);
                        pfVar64 = (float *)(lVar60 + -0x20 + lVar46);
                        pfVar2 = (float *)(lVar60 + -0x10 + lVar46);
                        pfVar3 = (float *)(lVar60 + lVar46);
                        auVar76._0_4_ =
                             fVar108 * *pfVar3 +
                             fVar107 * *pfVar2 + fVar93 * *pfVar64 +
                             fVar80 * *pfVar59 + auVar76._0_4_;
                        auVar76._4_4_ =
                             fVar108 * pfVar3[1] +
                             fVar107 * pfVar2[1] + fVar93 * pfVar64[1] +
                             fVar80 * pfVar59[1] + fVar109;
                        auVar76._8_4_ =
                             fVar108 * pfVar3[2] +
                             fVar107 * pfVar2[2] + fVar93 * pfVar64[2] +
                             fVar80 * pfVar59[2] + fVar110;
                        auVar76._12_4_ =
                             fVar108 * pfVar3[3] +
                             fVar107 * pfVar2[3] + fVar93 * pfVar64[3] +
                             fVar80 * pfVar59[3] + fVar92;
                      }
                      iVar31 = iVar31 + iVar30;
                    }
                  }
                  lVar60 = lVar60 + (long)(int)uVar49 * 0x40;
                }
                lVar41 = lVar41 + (long)(int)(uVar49 * uVar54 * 0x10) * 4;
              }
              auVar94 = auVar76;
              if (5 < iVar5 - 1U) goto switchD_00264070_caseD_1;
              fVar80 = auVar76._8_4_;
              fVar93 = auVar76._12_4_;
              auVar94 = maxps(auVar76,auVar72);
              switch(iVar5) {
              case 2:
                auVar76 = minps(auVar76,auVar72);
                fVar80 = *(this->super_Deconvolution).activation_params.data;
                auVar95._0_4_ = auVar94._0_4_ + fVar80 * auVar76._0_4_;
                auVar95._4_4_ = auVar94._4_4_ + fVar80 * auVar76._4_4_;
                auVar95._8_4_ = auVar94._8_4_ + fVar80 * auVar76._8_4_;
                auVar95._12_4_ = auVar94._12_4_ + fVar80 * auVar76._12_4_;
                auVar94 = auVar95;
                break;
              case 3:
                puVar1 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar71 = *puVar1;
                uVar4 = puVar1[1];
                auVar82._4_4_ = uVar71;
                auVar82._0_4_ = uVar71;
                auVar82._8_4_ = uVar71;
                auVar82._12_4_ = uVar71;
                auVar96._4_4_ = uVar4;
                auVar96._0_4_ = uVar4;
                auVar96._8_4_ = uVar4;
                auVar96._12_4_ = uVar4;
                auVar76 = maxps(auVar76,auVar82);
                auVar94 = minps(auVar76,auVar96);
                break;
              case 4:
                auVar75._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar75._8_4_ = -fVar80;
                auVar75._12_4_ = -fVar93;
                auVar76 = minps(auVar75,auVar74);
                auVar76 = maxps(auVar76,auVar81);
                fVar93 = auVar76._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar76._4_4_ * 1.442695 + 0.5;
                fVar110 = auVar76._8_4_ * 1.442695 + 0.5;
                fVar104 = auVar76._12_4_ * 1.442695 + 0.5;
                fVar80 = (float)(int)fVar93;
                fVar107 = (float)(int)fVar108;
                fVar109 = (float)(int)fVar110;
                fVar92 = (float)(int)fVar104;
                fVar80 = fVar80 - (float)(-(uint)(fVar93 < fVar80) & (uint)fVar89);
                fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)auVar87._0_4_);
                fVar109 = fVar109 - (float)(-(uint)(fVar110 < fVar109) & (uint)fVar90);
                fVar92 = fVar92 - (float)(-(uint)(fVar104 < fVar92) & (uint)fVar91);
                fVar93 = fVar80 * -0.6931472 + auVar76._0_4_;
                fVar108 = fVar107 * -0.6931472 + auVar76._4_4_;
                fVar110 = fVar109 * -0.6931472 + auVar76._8_4_;
                fVar104 = fVar92 * -0.6931472 + auVar76._12_4_;
                auVar14._4_4_ =
                     (float)((int)fVar107 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar14._0_4_ =
                     (float)((int)fVar80 * 0x800000 + (int)fVar89) *
                     (fVar93 + fVar89 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93) +
                     fVar89;
                auVar14._8_4_ =
                     (float)((int)fVar109 * 0x800000 + (int)fVar90) *
                     (fVar110 + fVar90 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar90;
                auVar14._12_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar91) *
                     (fVar104 + fVar91 +
                     (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104
                       + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104)
                     + fVar91;
                auVar94 = divps(auVar79,auVar14);
                break;
              case 5:
                auVar72 = minps(auVar76,auVar74);
                auVar81 = maxps(auVar72,auVar81);
                fVar107 = auVar81._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar81._4_4_ * 1.442695 + 0.5;
                fVar109 = auVar81._8_4_ * 1.442695 + 0.5;
                fVar110 = auVar81._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar105 = (float)(int)fVar109;
                fVar106 = (float)(int)fVar110;
                fVar92 = fVar92 - (float)(-(uint)(fVar107 < fVar92) & (uint)fVar89);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)auVar87._0_4_);
                fVar105 = fVar105 - (float)(-(uint)(fVar109 < fVar105) & (uint)fVar90);
                fVar106 = fVar106 - (float)(-(uint)(fVar110 < fVar106) & (uint)fVar91);
                fVar107 = auVar81._0_4_ - fVar92 * 0.6931472;
                fVar108 = auVar81._4_4_ - fVar104 * 0.6931472;
                fVar109 = auVar81._8_4_ - fVar105 * 0.6931472;
                fVar110 = auVar81._12_4_ - fVar106 * 0.6931472;
                auVar111._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar89) *
                     (fVar107 + fVar89 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar89;
                auVar111._4_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar111._8_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar90) *
                     (fVar109 + fVar90 +
                     (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109
                       + 0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5) * fVar109 * fVar109)
                     + fVar90;
                auVar111._12_4_ =
                     (float)((int)fVar106 * 0x800000 + (int)fVar91) *
                     (fVar110 + fVar91 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar91;
                auVar94 = maxps(auVar111,_DAT_00538720);
                fVar107 = (float)(auVar94._0_4_ & 0x807fffff | 0x3f000000);
                fVar109 = (float)(auVar94._4_4_ & 0x807fffff | 0x3f000000);
                fVar92 = (float)(auVar94._8_4_ & 0x807fffff | 0x3f000000);
                fVar105 = (float)(auVar94._12_4_ & 0x807fffff | 0x3f000000);
                fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                fVar110 = fVar109 + -1.0 + (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar109);
                fVar104 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                auVar72._0_8_ =
                     CONCAT44(-(uint)(auVar111._4_4_ <= 0.0),-(uint)(auVar111._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar72._8_4_ = -(uint)(auVar111._8_4_ <= 0.0) & 0x7fffffff;
                auVar72._12_4_ = -(uint)(auVar111._12_4_ <= 0.0) & 0x7fffffff;
                auVar81._4_4_ =
                     ~-(uint)(auVar111._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar94._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar109 < 0.70710677) & (uint)auVar87._0_4_)) *
                             0.6931472 + fVar110 +
                            (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) *
                                   fVar110 + -0.12420141) * fVar110 + 0.14249323) * fVar110 +
                                -0.16668057) * fVar110 + 0.20000714) * fVar110 + -0.24999994) *
                              fVar110 + 0.3333333) * fVar110 + -0.5) * fVar110 * fVar110) * -2.0);
                auVar81._0_4_ =
                     ~-(uint)(auVar111._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar94._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar89)) * 0.6931472 +
                             fVar108 +
                            (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) *
                                   fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                              fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                auVar81._8_4_ =
                     ~-(uint)(auVar111._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar94._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar90)) * 0.6931472 +
                             fVar104 +
                            (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                                   fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                              fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                auVar81._12_4_ =
                     ~-(uint)(auVar111._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar94._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar91)) * 0.6931472 +
                             fVar106 +
                            (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984) *
                                   fVar106 + -0.12420141) * fVar106 + 0.14249323) * fVar106 +
                                -0.16668057) * fVar106 + 0.20000714) * fVar106 + -0.24999994) *
                              fVar106 + 0.3333333) * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                auVar81 = minps(auVar72 | auVar81,auVar74);
                auVar81 = maxps(auVar81,_DAT_00538680);
                fVar107 = auVar81._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar81._4_4_ * 1.442695 + 0.5;
                fVar109 = auVar81._8_4_ * 1.442695 + 0.5;
                fVar110 = auVar81._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar105 = (float)(int)fVar109;
                fVar106 = (float)(int)fVar110;
                fVar92 = fVar92 - (float)(-(uint)(fVar107 < fVar92) & (uint)fVar89);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)auVar87._0_4_);
                fVar105 = fVar105 - (float)(-(uint)(fVar109 < fVar105) & (uint)fVar90);
                fVar106 = fVar106 - (float)(-(uint)(fVar110 < fVar106) & (uint)fVar91);
                fVar107 = auVar81._0_4_ - fVar92 * 0.6931472;
                fVar108 = auVar81._4_4_ - fVar104 * 0.6931472;
                fVar109 = auVar81._8_4_ - fVar105 * 0.6931472;
                fVar110 = auVar81._12_4_ - fVar106 * 0.6931472;
                auVar72 = ZEXT816(0);
                auVar11._4_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar11._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar89) *
                     (fVar107 + fVar89 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar89;
                auVar11._8_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar90) *
                     (fVar109 + fVar90 +
                     (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109
                       + 0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5) * fVar109 * fVar109)
                     + fVar90;
                auVar11._12_4_ =
                     (float)((int)fVar106 * 0x800000 + (int)fVar91) *
                     (fVar110 + fVar91 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar91;
                auVar81 = divps(_DAT_00539130,auVar11);
                auVar98._0_4_ = auVar81._0_4_ + -1.0;
                auVar98._4_4_ = auVar81._4_4_ + -1.0;
                auVar98._8_4_ = auVar81._8_4_ + -1.0;
                auVar98._12_4_ = auVar81._12_4_ + -1.0;
                auVar81 = _DAT_00538680;
                goto LAB_002643b0;
              case 6:
                pfVar59 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar107 = *pfVar59;
                fVar108 = pfVar59[1];
                auVar97._0_4_ = fVar107 * auVar76._0_4_ + fVar108;
                auVar97._4_4_ = fVar107 * auVar76._4_4_ + fVar108;
                auVar97._8_4_ = fVar107 * fVar80 + fVar108;
                auVar97._12_4_ = fVar107 * fVar93 + fVar108;
                auVar94 = maxps(auVar97,auVar72);
                auVar98 = minps(auVar94,auVar79);
LAB_002643b0:
                auVar94._0_4_ = auVar98._0_4_ * auVar76._0_4_;
                auVar94._4_4_ = auVar98._4_4_ * auVar76._4_4_;
                auVar94._8_4_ = auVar98._8_4_ * fVar80;
                auVar94._12_4_ = auVar98._12_4_ * fVar93;
              }
switchD_00264070_caseD_1:
              *local_240 = auVar94;
              local_240 = local_240 + 1;
              iVar61 = iVar61 + 1;
            }
          }
        }
      }
      auVar79 = _DAT_005386b0;
      auVar74 = _DAT_00538670;
      if ((int)local_138 == 1 && bVar58 == 0) {
        uVar66 = (this->super_Deconvolution).kernel_w;
        uVar51 = (this->super_Deconvolution).kernel_h;
        iVar30 = (this->super_Deconvolution).dilation_w;
        iVar42 = (this->super_Deconvolution).dilation_h;
        iVar65 = (this->super_Deconvolution).stride_w;
        iVar50 = (this->super_Deconvolution).stride_h;
        iVar5 = (this->super_Deconvolution).activation_type;
        pvVar9 = (this->super_Deconvolution).bias_data.data;
        uVar55 = 0;
        if (0 < (int)uVar66) {
          uVar55 = (ulong)uVar66;
        }
        uVar57 = 0;
        if (0 < (int)uVar51) {
          uVar57 = (ulong)uVar51;
        }
        uVar49 = local_1c8.c;
        if (local_1c8.c < 1) {
          uVar49 = 0;
        }
        auVar72 = (undefined1  [16])0x0;
        fVar89 = (float)DAT_005386b0;
        auVar87._0_4_ = DAT_005386b0._4_4_;
        fVar90 = DAT_005386b0._8_4_;
        fVar91 = DAT_005386b0._12_4_;
        auVar81 = _DAT_00538680;
        for (uVar43 = 0; uVar43 != uVar49; uVar43 = uVar43 + 1) {
          local_240 = (undefined1 (*) [16])
                      (local_1c8.cstep * uVar43 * local_1c8.elemsize + (long)local_1c8.data);
          iVar28 = bottom_blob->w;
          iVar27 = bottom_blob->h;
          uVar47 = 0;
          uVar68 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar68 = uVar47;
          }
          uVar54 = local_1c8.w;
          if (local_1c8.w < 1) {
            uVar54 = 0;
          }
          uVar48 = local_1c8.h;
          if (local_1c8.h < 1) {
            uVar48 = 0;
          }
          while (uVar36 = (uint)uVar47, uVar36 != uVar48) {
            iVar61 = (1 - uVar66) * iVar30;
            for (uVar35 = 0; uVar35 != uVar54; uVar35 = uVar35 + 1) {
              if (pvVar9 == (void *)0x0) {
                auVar76 = ZEXT816(0);
              }
              else {
                auVar76 = *(undefined1 (*) [16])((long)pvVar9 + uVar43 * 0x10);
              }
              pvVar69 = (void *)((this->weight_data_tm).cstep * uVar43 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar47 = 0; uVar47 != uVar68; uVar47 = uVar47 + 1) {
                pvVar44 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar47 +
                                  (long)bottom_blob->data);
                local_178._0_8_ = pvVar44;
                local_158._0_8_ = pvVar69;
                pvVar63 = pvVar69;
                for (uVar52 = 0; uVar52 != uVar57; uVar52 = uVar52 + 1) {
                  iVar31 = (((int)uVar52 - uVar51) + 1) * iVar42 + uVar36;
                  if (((-1 < iVar31) && (iVar32 = iVar31 / iVar50, iVar31 % iVar50 == 0)) &&
                     (iVar32 < iVar27)) {
                    iVar31 = iVar61;
                    for (lVar41 = 0; uVar55 * 0x10 != lVar41; lVar41 = lVar41 + 0x10) {
                      auVar77 = auVar76;
                      if (((-1 < iVar31) && (iVar34 = iVar31 / iVar65, iVar31 % iVar65 == 0)) &&
                         (iVar34 < iVar28)) {
                        fVar80 = *(float *)((long)pvVar44 +
                                           (long)iVar34 * 4 +
                                           (long)iVar32 *
                                           (long)bottom_blob->w * bottom_blob->elemsize);
                        pfVar59 = (float *)((long)pvVar63 + lVar41);
                        auVar77._0_4_ = auVar76._0_4_ + fVar80 * *pfVar59;
                        auVar77._4_4_ = auVar76._4_4_ + fVar80 * pfVar59[1];
                        auVar77._8_4_ = auVar76._8_4_ + fVar80 * pfVar59[2];
                        auVar77._12_4_ = auVar76._12_4_ + fVar80 * pfVar59[3];
                      }
                      iVar31 = iVar31 + iVar30;
                      auVar76 = auVar77;
                    }
                  }
                  pvVar63 = (void *)((long)pvVar63 + (long)(int)uVar66 * 0x10);
                }
                pvVar69 = (void *)((long)pvVar69 + (long)(int)(uVar66 * uVar51 * 4) * 4);
              }
              auVar99 = auVar76;
              if (5 < iVar5 - 1U) goto switchD_0026473f_caseD_1;
              fVar80 = auVar76._8_4_;
              fVar93 = auVar76._12_4_;
              auVar99 = maxps(auVar76,auVar72);
              switch(iVar5) {
              case 2:
                auVar76 = minps(auVar76,auVar72);
                fVar80 = *(this->super_Deconvolution).activation_params.data;
                auVar100._0_4_ = auVar99._0_4_ + fVar80 * auVar76._0_4_;
                auVar100._4_4_ = auVar99._4_4_ + fVar80 * auVar76._4_4_;
                auVar100._8_4_ = auVar99._8_4_ + fVar80 * auVar76._8_4_;
                auVar100._12_4_ = auVar99._12_4_ + fVar80 * auVar76._12_4_;
                auVar99 = auVar100;
                break;
              case 3:
                puVar1 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar71 = *puVar1;
                uVar4 = puVar1[1];
                auVar84._4_4_ = uVar71;
                auVar84._0_4_ = uVar71;
                auVar84._8_4_ = uVar71;
                auVar84._12_4_ = uVar71;
                auVar101._4_4_ = uVar4;
                auVar101._0_4_ = uVar4;
                auVar101._8_4_ = uVar4;
                auVar101._12_4_ = uVar4;
                auVar76 = maxps(auVar76,auVar84);
                auVar99 = minps(auVar76,auVar101);
                break;
              case 4:
                auVar78._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar78._8_4_ = -fVar80;
                auVar78._12_4_ = -fVar93;
                auVar76 = minps(auVar78,auVar74);
                auVar76 = maxps(auVar76,auVar81);
                fVar93 = auVar76._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar76._4_4_ * 1.442695 + 0.5;
                fVar110 = auVar76._8_4_ * 1.442695 + 0.5;
                fVar104 = auVar76._12_4_ * 1.442695 + 0.5;
                fVar80 = (float)(int)fVar93;
                fVar107 = (float)(int)fVar108;
                fVar109 = (float)(int)fVar110;
                fVar92 = (float)(int)fVar104;
                fVar80 = fVar80 - (float)(-(uint)(fVar93 < fVar80) & (uint)fVar89);
                fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)auVar87._0_4_);
                fVar109 = fVar109 - (float)(-(uint)(fVar110 < fVar109) & (uint)fVar90);
                fVar92 = fVar92 - (float)(-(uint)(fVar104 < fVar92) & (uint)fVar91);
                fVar93 = fVar80 * -0.6931472 + auVar76._0_4_;
                fVar108 = fVar107 * -0.6931472 + auVar76._4_4_;
                fVar110 = fVar109 * -0.6931472 + auVar76._8_4_;
                fVar104 = fVar92 * -0.6931472 + auVar76._12_4_;
                auVar15._4_4_ =
                     (float)((int)fVar107 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar15._0_4_ =
                     (float)((int)fVar80 * 0x800000 + (int)fVar89) *
                     (fVar93 + fVar89 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93) +
                     fVar89;
                auVar15._8_4_ =
                     (float)((int)fVar109 * 0x800000 + (int)fVar90) *
                     (fVar110 + fVar90 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar90;
                auVar15._12_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar91) *
                     (fVar104 + fVar91 +
                     (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) * fVar104
                       + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) * fVar104 * fVar104)
                     + fVar91;
                auVar99 = divps(auVar79,auVar15);
                break;
              case 5:
                auVar72 = minps(auVar76,auVar74);
                auVar81 = maxps(auVar72,auVar81);
                fVar107 = auVar81._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar81._4_4_ * 1.442695 + 0.5;
                fVar109 = auVar81._8_4_ * 1.442695 + 0.5;
                fVar110 = auVar81._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar105 = (float)(int)fVar109;
                fVar106 = (float)(int)fVar110;
                fVar92 = fVar92 - (float)(-(uint)(fVar107 < fVar92) & (uint)fVar89);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)auVar87._0_4_);
                fVar105 = fVar105 - (float)(-(uint)(fVar109 < fVar105) & (uint)fVar90);
                fVar106 = fVar106 - (float)(-(uint)(fVar110 < fVar106) & (uint)fVar91);
                fVar107 = auVar81._0_4_ - fVar92 * 0.6931472;
                fVar108 = auVar81._4_4_ - fVar104 * 0.6931472;
                fVar109 = auVar81._8_4_ - fVar105 * 0.6931472;
                fVar110 = auVar81._12_4_ - fVar106 * 0.6931472;
                auVar112._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar89) *
                     (fVar107 + fVar89 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar89;
                auVar112._4_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar112._8_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar90) *
                     (fVar109 + fVar90 +
                     (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109
                       + 0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5) * fVar109 * fVar109)
                     + fVar90;
                auVar112._12_4_ =
                     (float)((int)fVar106 * 0x800000 + (int)fVar91) *
                     (fVar110 + fVar91 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar91;
                auVar81 = maxps(auVar112,_DAT_00538720);
                fVar107 = (float)(auVar81._0_4_ & 0x807fffff | 0x3f000000);
                fVar109 = (float)(auVar81._4_4_ & 0x807fffff | 0x3f000000);
                fVar92 = (float)(auVar81._8_4_ & 0x807fffff | 0x3f000000);
                fVar105 = (float)(auVar81._12_4_ & 0x807fffff | 0x3f000000);
                fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                fVar110 = fVar109 + -1.0 + (float)(-(uint)(fVar109 < 0.70710677) & (uint)fVar109);
                fVar104 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                auVar83._0_8_ =
                     CONCAT44(-(uint)(auVar112._4_4_ <= 0.0),-(uint)(auVar112._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar83._8_4_ = -(uint)(auVar112._8_4_ <= 0.0) & 0x7fffffff;
                auVar83._12_4_ = -(uint)(auVar112._12_4_ <= 0.0) & 0x7fffffff;
                auVar12._4_4_ =
                     ~-(uint)(auVar112._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar81._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar109 < 0.70710677) & (uint)auVar87._0_4_)) *
                             0.6931472 + fVar110 +
                            (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) *
                                   fVar110 + -0.12420141) * fVar110 + 0.14249323) * fVar110 +
                                -0.16668057) * fVar110 + 0.20000714) * fVar110 + -0.24999994) *
                              fVar110 + 0.3333333) * fVar110 + -0.5) * fVar110 * fVar110) * -2.0);
                auVar12._0_4_ =
                     ~-(uint)(auVar112._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar81._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar89)) * 0.6931472 +
                             fVar108 +
                            (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) *
                                   fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                              fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                auVar12._8_4_ =
                     ~-(uint)(auVar112._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar81._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar90)) * 0.6931472 +
                             fVar104 +
                            (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                                   fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                              fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                auVar12._12_4_ =
                     ~-(uint)(auVar112._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar81._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar91)) * 0.6931472 +
                             fVar106 +
                            (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984) *
                                   fVar106 + -0.12420141) * fVar106 + 0.14249323) * fVar106 +
                                -0.16668057) * fVar106 + 0.20000714) * fVar106 + -0.24999994) *
                              fVar106 + 0.3333333) * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                auVar81 = minps(auVar83 | auVar12,auVar74);
                auVar81 = maxps(auVar81,_DAT_00538680);
                fVar107 = auVar81._0_4_ * 1.442695 + 0.5;
                fVar108 = auVar81._4_4_ * 1.442695 + 0.5;
                fVar109 = auVar81._8_4_ * 1.442695 + 0.5;
                fVar110 = auVar81._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar105 = (float)(int)fVar109;
                fVar106 = (float)(int)fVar110;
                fVar92 = fVar92 - (float)(-(uint)(fVar107 < fVar92) & (uint)fVar89);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)auVar87._0_4_);
                fVar105 = fVar105 - (float)(-(uint)(fVar109 < fVar105) & (uint)fVar90);
                fVar106 = fVar106 - (float)(-(uint)(fVar110 < fVar106) & (uint)fVar91);
                fVar107 = auVar81._0_4_ - fVar92 * 0.6931472;
                fVar108 = auVar81._4_4_ - fVar104 * 0.6931472;
                fVar109 = auVar81._8_4_ - fVar105 * 0.6931472;
                fVar110 = auVar81._12_4_ - fVar106 * 0.6931472;
                auVar72 = ZEXT816(0);
                auVar13._4_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)auVar87._0_4_) *
                     (fVar108 + auVar87._0_4_ +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + auVar87._0_4_;
                auVar13._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar89) *
                     (fVar107 + fVar89 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar89;
                auVar13._8_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar90) *
                     (fVar109 + fVar90 +
                     (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109
                       + 0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5) * fVar109 * fVar109)
                     + fVar90;
                auVar13._12_4_ =
                     (float)((int)fVar106 * 0x800000 + (int)fVar91) *
                     (fVar110 + fVar91 +
                     (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110
                       + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5) * fVar110 * fVar110)
                     + fVar91;
                auVar81 = divps(_DAT_00539130,auVar13);
                auVar103._0_4_ = auVar81._0_4_ + -1.0;
                auVar103._4_4_ = auVar81._4_4_ + -1.0;
                auVar103._8_4_ = auVar81._8_4_ + -1.0;
                auVar103._12_4_ = auVar81._12_4_ + -1.0;
                auVar81 = _DAT_00538680;
                goto LAB_00264a8e;
              case 6:
                pfVar59 = (float *)(this->super_Deconvolution).activation_params.data;
                fVar107 = *pfVar59;
                fVar108 = pfVar59[1];
                auVar102._0_4_ = fVar107 * auVar76._0_4_ + fVar108;
                auVar102._4_4_ = fVar107 * auVar76._4_4_ + fVar108;
                auVar102._8_4_ = fVar107 * fVar80 + fVar108;
                auVar102._12_4_ = fVar107 * fVar93 + fVar108;
                auVar94 = maxps(auVar102,auVar72);
                auVar103 = minps(auVar94,auVar79);
LAB_00264a8e:
                auVar99._0_4_ = auVar103._0_4_ * auVar76._0_4_;
                auVar99._4_4_ = auVar103._4_4_ * auVar76._4_4_;
                auVar99._8_4_ = auVar103._8_4_ * fVar80;
                auVar99._12_4_ = auVar103._12_4_ * fVar93;
              }
switchD_0026473f_caseD_1:
              *local_240 = auVar99;
              local_240 = local_240 + 1;
              iVar61 = iVar61 + 1;
            }
            uVar47 = (ulong)(uVar36 + 1);
          }
        }
      }
      if (((int)local_138 == 4) && (bVar58 != 0)) {
        uVar66 = (this->super_Deconvolution).kernel_w;
        uVar51 = (this->super_Deconvolution).kernel_h;
        iVar30 = (this->super_Deconvolution).dilation_w;
        iVar42 = (this->super_Deconvolution).dilation_h;
        iVar65 = (this->super_Deconvolution).stride_w;
        iVar50 = (this->super_Deconvolution).activation_type;
        local_120 = (void *)(local_1c8.elemsize * local_1c8.cstep);
        uVar55 = 0;
        uVar57 = 0;
        if (0 < (int)uVar66) {
          uVar57 = (ulong)uVar66;
        }
        uVar43 = 0;
        if (0 < (int)uVar51) {
          uVar43 = (ulong)uVar51;
        }
        uVar68 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar68 = uVar55;
        }
        uVar49 = local_1c8.w;
        if (local_1c8.w < 1) {
          uVar49 = 0;
        }
        uVar54 = local_1c8.h;
        if (local_1c8.h < 1) {
          uVar54 = 0;
        }
        local_118 = (ulong)(uint)local_1c8.c;
        if (local_1c8.c < 1) {
          local_118 = uVar55;
        }
        iVar5 = (this->super_Deconvolution).stride_h;
        pvVar9 = (this->super_Deconvolution).bias_data.data;
        local_128 = local_1c8.data;
        iVar28 = bottom_blob->w;
        local_178._0_4_ = bottom_blob->h;
        for (; uVar55 != local_118; uVar55 = uVar55 + 1) {
          local_240 = (undefined1 (*) [16])((long)local_120 * uVar55 + (long)local_128);
          for (uVar48 = 0; uVar48 != uVar54; uVar48 = uVar48 + 1) {
            pfVar59 = (float *)(this->super_Deconvolution).activation_params.data;
            sVar7 = (this->weight_data_tm).cstep;
            sVar8 = (this->weight_data_tm).elemsize;
            pvVar69 = (this->weight_data_tm).data;
            iVar27 = (1 - uVar66) * iVar30;
            for (uVar36 = 0; uVar36 != uVar49; uVar36 = uVar36 + 1) {
              if (pvVar9 == (void *)0x0) {
                fVar89 = 0.0;
              }
              else {
                fVar89 = *(float *)((long)pvVar9 + uVar55 * 4);
              }
              auVar74 = ZEXT816(0);
              pvVar63 = (void *)(sVar7 * uVar55 * sVar8 + (long)pvVar69);
              for (uVar47 = 0; uVar47 != uVar68; uVar47 = uVar47 + 1) {
                local_158._0_8_ = pvVar63;
                pvVar44 = pvVar63;
                for (uVar52 = 0; uVar52 != uVar43; uVar52 = uVar52 + 1) {
                  iVar61 = (((int)uVar52 - uVar51) + 1) * iVar42 + uVar48;
                  if (((-1 < iVar61) && (iVar31 = iVar61 / iVar5, iVar61 % iVar5 == 0)) &&
                     (iVar31 < (int)local_178._0_4_)) {
                    iVar61 = iVar27;
                    for (lVar41 = 0; uVar57 * 0x10 != lVar41; lVar41 = lVar41 + 0x10) {
                      auVar79 = auVar74;
                      if (((-1 < iVar61) && (iVar32 = iVar61 / iVar65, iVar61 % iVar65 == 0)) &&
                         (iVar32 < iVar28)) {
                        pfVar64 = (float *)((long)pvVar44 + lVar41);
                        pfVar2 = (float *)((long)bottom_blob->data +
                                          (long)(iVar32 << 2) * 4 +
                                          (long)iVar31 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar47);
                        auVar79._0_4_ = auVar74._0_4_ + *pfVar64 * *pfVar2;
                        auVar79._4_4_ = auVar74._4_4_ + pfVar64[1] * pfVar2[1];
                        auVar79._8_4_ = auVar74._8_4_ + pfVar64[2] * pfVar2[2];
                        auVar79._12_4_ = auVar74._12_4_ + pfVar64[3] * pfVar2[3];
                      }
                      iVar61 = iVar61 + iVar30;
                      auVar74 = auVar79;
                    }
                  }
                  pvVar44 = (void *)((long)pvVar44 + (long)(int)uVar66 * 0x10);
                }
                pvVar63 = (void *)((long)pvVar63 + (long)(int)(uVar66 * uVar51 * 4) * 4);
              }
              auVar86._4_4_ = auVar74._12_4_ + auVar74._4_4_;
              auVar86._0_4_ = auVar86._4_4_;
              auVar86._8_4_ = auVar86._4_4_;
              auVar86._12_4_ = auVar86._4_4_;
              auVar87._4_12_ = auVar86._4_12_;
              auVar87._0_4_ = auVar86._4_4_ + fVar89 + auVar74._8_4_ + auVar74._0_4_;
              fVar89 = auVar87._0_4_;
              switch(iVar50) {
              case 1:
                if (auVar87._0_4_ <= 0.0) {
                  auVar16._12_4_ = 0;
                  auVar16._0_12_ = auVar87._4_12_;
                  auVar87 = auVar16 << 0x20;
                }
LAB_00264e0e:
                fVar89 = auVar87._0_4_;
                break;
              case 2:
                fVar89 = (float)(~-(uint)(0.0 < auVar87._0_4_) & (uint)*pfVar59 |
                                -(uint)(0.0 < auVar87._0_4_) & 0x3f800000) * auVar87._0_4_;
                break;
              case 3:
                if (auVar87._0_4_ <= *pfVar59) {
                  auVar87._0_4_ = *pfVar59;
                }
                fVar89 = pfVar59[1];
                if (auVar87._0_4_ <= fVar89) {
                  fVar89 = auVar87._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= auVar87._0_4_) {
                  auVar87._0_4_ = 88.37626;
                }
                fVar89 = expf((float)(-(uint)(auVar87._0_4_ < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(auVar87._0_4_ < -88.37626) & (uint)-auVar87._0_4_));
                fVar89 = 1.0 / (fVar89 + 1.0);
                break;
              case 5:
                local_158 = auVar87;
                fVar89 = expf(auVar87._0_4_);
                fVar89 = logf(fVar89 + 1.0);
                fVar89 = tanhf(fVar89);
                fVar89 = fVar89 * (float)local_158._0_4_;
                break;
              case 6:
                fVar90 = *pfVar59;
                fVar91 = -pfVar59[1] / fVar90;
                fVar89 = 0.0;
                if (fVar91 <= auVar87._0_4_) {
                  if (fVar91 + 1.0 / fVar90 < auVar87._0_4_) goto LAB_00264e0e;
                  fVar89 = (fVar90 * auVar87._0_4_ + pfVar59[1]) * auVar87._0_4_;
                }
              }
              *(float *)local_240 = fVar89;
              local_240 = (undefined1 (*) [16])((long)local_240 + 4);
              iVar27 = iVar27 + 1;
            }
          }
        }
      }
      if (bVar58 == 1 && (int)local_138 == 1) {
        uVar66 = (this->super_Deconvolution).num_output;
        local_120 = local_1c8.data;
        local_128 = (void *)(local_1c8.cstep * local_1c8.elemsize);
        iVar30 = bottom_blob->w;
        iVar42 = bottom_blob->h;
        lVar41 = (long)local_1c8.w;
        uVar57 = 0;
        uVar55 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar55 = uVar57;
        }
        uVar43 = 0;
        if (0 < local_1c8.w) {
          uVar43 = (ulong)(uint)local_1c8.w;
        }
        uVar68 = (ulong)(uint)local_1c8.h;
        if (local_1c8.h < 1) {
          uVar68 = uVar57;
        }
        local_118 = (ulong)uVar66;
        if ((int)uVar66 < 1) {
          local_118 = uVar57;
        }
        local_160 = local_160 << 2;
        for (uVar57 = 0; uVar57 != local_118; uVar57 = uVar57 + 1) {
          local_228 = (void *)((long)local_128 * uVar57 + (long)local_120);
          for (iVar65 = 0; iVar65 != (int)uVar68; iVar65 = iVar65 + 1) {
            iVar5 = (this->super_Deconvolution).bias_term;
            iVar28 = (this->super_Deconvolution).activation_type;
            pvVar9 = (this->super_Deconvolution).bias_data.data;
            iVar27 = iVar65 - local_13c;
            sVar7 = (this->weight_data_tm).cstep;
            sVar8 = (this->weight_data_tm).elemsize;
            pvVar69 = (this->weight_data_tm).data;
            pfVar59 = (float *)(this->super_Deconvolution).activation_params.data;
            iVar50 = -iVar29;
            for (uVar47 = 0; uVar47 != uVar43; uVar47 = uVar47 + 1) {
              if (iVar5 == 0) {
                auVar85 = ZEXT812(0);
              }
              else {
                auVar85._4_8_ = 0;
                auVar85._0_4_ = *(uint *)((long)pvVar9 + uVar57 * 4);
              }
              auVar88._12_4_ = 0;
              auVar88._0_12_ = auVar85;
              iVar61 = (this->super_Deconvolution).stride_h;
              uVar66 = (this->super_Deconvolution).kernel_w;
              uVar51 = (this->super_Deconvolution).kernel_h;
              uVar52 = 0;
              if (0 < (int)uVar66) {
                uVar52 = (ulong)uVar66;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              iVar31 = (this->super_Deconvolution).stride_w;
              pvVar63 = (void *)(sVar7 * uVar57 * sVar8 + (long)pvVar69);
              for (uVar39 = 0; fVar89 = auVar88._0_4_, uVar39 != uVar55; uVar39 = uVar39 + 1) {
                local_158._0_8_ = uVar39;
                pvVar45 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar39 +
                                  (long)bottom_blob->data);
                local_178._0_8_ = pvVar45;
                pvVar44 = pvVar63;
                for (uVar53 = 0; uVar53 != uVar51; uVar53 = uVar53 + 1) {
                  iVar32 = (this->super_Deconvolution).dilation_h * (int)uVar53 + iVar27;
                  if (((-1 < iVar32) && (iVar34 = iVar32 / iVar61, iVar32 % iVar61 == 0)) &&
                     (iVar34 < iVar42)) {
                    iVar32 = iVar50;
                    for (uVar67 = 0; uVar52 != uVar67; uVar67 = uVar67 + 1) {
                      if (((-1 < iVar32) && (iVar37 = iVar32 / iVar31, iVar32 % iVar31 == 0)) &&
                         (iVar37 < iVar30)) {
                        auVar88._0_4_ =
                             auVar88._0_4_ +
                             *(float *)((long)pvVar44 + uVar67 * 4) *
                             *(float *)((long)pvVar45 +
                                       (long)iVar37 * 4 +
                                       (long)iVar34 * (long)bottom_blob->w * bottom_blob->elemsize);
                      }
                      iVar32 = iVar32 + (this->super_Deconvolution).dilation_w;
                    }
                  }
                  pvVar44 = (void *)((long)pvVar44 + (long)(int)uVar66 * 4);
                }
                pvVar63 = (void *)((long)pvVar63 + local_160);
              }
              auVar73 = auVar88;
              switch(iVar28) {
              case 1:
                if (fVar89 <= 0.0) {
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = auVar88._4_12_;
                  auVar73 = auVar17 << 0x20;
                }
                break;
              case 2:
                auVar73 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar89) & (uint)*pfVar59 |
                                                -(uint)(0.0 < fVar89) & 0x3f800000) * fVar89));
                break;
              case 3:
                if (fVar89 <= *pfVar59) {
                  auVar88._0_4_ = *pfVar59;
                }
                fVar89 = pfVar59[1];
                auVar73 = auVar88;
                if (fVar89 < auVar88._0_4_) {
LAB_00265427:
                  auVar73 = ZEXT416((uint)fVar89);
                }
                break;
              case 4:
                if (88.37626 <= fVar89) {
                  fVar89 = 88.37626;
                }
                fVar89 = expf((float)(-(uint)(fVar89 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar89 < -88.37626) & (uint)-fVar89));
                auVar73 = ZEXT416((uint)(1.0 / (fVar89 + 1.0)));
                break;
              case 5:
                local_178 = auVar88;
                fVar89 = expf(fVar89);
                fVar89 = logf(fVar89 + 1.0);
                fVar89 = tanhf(fVar89);
                auVar73._0_4_ = fVar89 * (float)local_178._0_4_;
                auVar73._4_12_ = extraout_var;
                break;
              case 6:
                auVar87._0_4_ = *pfVar59;
                fVar90 = -pfVar59[1] / auVar87._0_4_;
                auVar73 = (undefined1  [16])0x0;
                if ((fVar90 <= fVar89) &&
                   (auVar73 = auVar88, fVar89 <= fVar90 + 1.0 / auVar87._0_4_)) {
                  fVar89 = (auVar87._0_4_ * fVar89 + pfVar59[1]) * fVar89;
                  goto LAB_00265427;
                }
              }
              *(int *)((long)local_228 + uVar47 * 4) = auVar73._0_4_;
              iVar50 = iVar50 + 1;
            }
            local_228 = (void *)((long)local_228 + lVar41 * 4);
          }
        }
      }
    }
    pMVar26 = local_130;
    Deconvolution::cut_padding(&this->super_Deconvolution,&local_1c8,local_130,local_148);
    if ((pMVar26->data == (void *)0x0) || (iVar30 = 0, (long)pMVar26->c * pMVar26->cstep == 0)) {
      iVar30 = -100;
    }
  }
LAB_00265995:
  piVar6 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        free(local_1c8.data);
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}